

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi-type-conversions.cpp
# Opt level: O0

void TestConversions<ompi_communicator_t_*,_diy::mpi::communicator>::Run(ompi_communicator_t *mt)

{
  MPI_Comm poVar1;
  ompi_communicator_t *mt2;
  communicator dc1;
  MPI_Comm in_stack_ffffffffffffff98;
  communicator *in_stack_ffffffffffffffa0;
  communicator local_38 [2];
  
  diy::mpi::communicator::communicator(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  diy::mpi::communicator::communicator(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  ExpectsDIYClass(local_38);
  diy::mpi::communicator::~communicator((communicator *)0x10b9ef);
  diy::mpi::communicator::operator_cast_to_ompi_communicator_t_((communicator *)0x10b9f9);
  poVar1 = diy::mpi::communicator::operator_cast_to_ompi_communicator_t_((communicator *)0x10ba14);
  ExpectsMPIType(poVar1);
  diy::mpi::communicator::~communicator((communicator *)0x10ba31);
  return;
}

Assistant:

static void Run(MPIType mt = MPIType{})
  {
    // test initialization
    DIYClass dc1 = mt;

    // can we pass MPIType object where an object of DIYHandle is expected?
    ExpectsDIYClass(mt);

    // test conversion operator
    MPIType mt2 = dc1;
    static_cast<void>(mt2);

    // can we pass DIYHandle object where an object of MPIType is expected?
    ExpectsMPIType(dc1);
  }